

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O1

AActor * __thiscall FBlockThingsIterator::Next(FBlockThingsIterator *this,bool centeronly)

{
  HashEntry *pHVar1;
  TArray<FBlockThingsIterator::HashEntry,_FBlockThingsIterator::HashEntry> *this_00;
  double dVar2;
  AActor *pAVar3;
  bool bVar4;
  int iVar5;
  FBlockNode **ppFVar6;
  int iVar7;
  AActor *pAVar8;
  HashEntry *pHVar9;
  HashEntry *pHVar10;
  long lVar11;
  HashEntry *pHVar12;
  uint uVar13;
  uint uVar14;
  FBlockNode *pFVar15;
  double dVar16;
  
  pHVar1 = this->FixedHash;
  this_00 = &this->DynHash;
  pAVar8 = (AActor *)this_00;
  do {
    ppFVar6 = blocklinks;
    iVar5 = bmapheight;
    iVar7 = bmapwidth;
    pFVar15 = this->block;
    uVar14 = this->curx;
    uVar13 = this->cury;
    while (pFVar15 == (FBlockNode *)0x0) {
      this->curx = uVar14 + 1;
      bVar4 = this->maxx <= (int)uVar14;
      uVar14 = uVar14 + 1;
      if (bVar4) {
        this->curx = this->minx;
        this->cury = uVar13 + 1;
        bVar4 = this->maxy <= (int)uVar13;
        uVar14 = this->minx;
        uVar13 = uVar13 + 1;
        if (bVar4) {
          return (AActor *)0x0;
        }
      }
      if (((int)(uVar13 | uVar14) < 0) || (iVar7 <= (int)uVar14)) {
        pFVar15 = (FBlockNode *)0x0;
      }
      else {
        pFVar15 = (FBlockNode *)0x0;
        if ((int)uVar13 < iVar5) {
          pFVar15 = ppFVar6[iVar7 * uVar13 + uVar14];
        }
      }
      this->block = pFVar15;
    }
    pAVar3 = pFVar15->Me;
    this->block = pFVar15->NextActor;
    if ((pFVar15->NextBlock == (FBlockNode *)0x0) && (pFVar15->PrevBlock == &pAVar3->BlockNode)) {
      bVar4 = false;
      pAVar8 = pAVar3;
    }
    else {
      if (centeronly) {
        dVar16 = (double)(this->curx << 7) + bmaporgx;
        dVar2 = (pAVar3->__Pos).X;
        if ((dVar2 < dVar16) || (dVar16 + 128.0 <= dVar2)) {
LAB_0041accb:
          bVar4 = true;
        }
        else {
          dVar16 = (double)(this->cury << 7) + bmaporgy;
          dVar2 = (pAVar3->__Pos).Y;
          if ((dVar2 < dVar16) || (dVar16 + 128.0 <= dVar2)) goto LAB_0041accb;
          bVar4 = false;
          pAVar8 = pAVar3;
        }
        if (bVar4) {
LAB_0041acd1:
          bVar4 = true;
          goto LAB_0041ad47;
        }
      }
      else {
        uVar14 = (uint)((ulong)pAVar3 >> 3) & 0x1f;
        lVar11 = (long)this->Buckets[uVar14];
        bVar4 = lVar11 >= 0;
        if (lVar11 < 0) {
LAB_0041ac9d:
          iVar7 = this->NumFixedHash;
          lVar11 = (long)iVar7;
          if (lVar11 < 10) {
            pHVar10 = pHVar1 + lVar11;
            this->FixedHash[lVar11].Next = this->Buckets[uVar14];
            this->NumFixedHash = iVar7 + 1;
          }
          else {
            if ((this->DynHash).Count == 0) {
              TArray<FBlockThingsIterator::HashEntry,_FBlockThingsIterator::HashEntry>::Grow
                        (this_00,0x32);
            }
            TArray<FBlockThingsIterator::HashEntry,_FBlockThingsIterator::HashEntry>::Grow
                      (this_00,1);
            uVar13 = (this->DynHash).Count;
            (this->DynHash).Count = uVar13 + 1;
            pHVar9 = (this->DynHash).Array;
            iVar7 = uVar13 + 10;
            pHVar10 = pHVar9 + (int)uVar13;
            pHVar9[(int)uVar13].Next = this->Buckets[uVar14];
          }
          this->Buckets[uVar14] = iVar7;
          pHVar10->Actor = pAVar3;
          pAVar8 = pAVar3;
        }
        else {
          pHVar9 = (this->DynHash).Array + -10;
          pHVar10 = pHVar9;
          if (this->Buckets[uVar14] < 10) {
            pHVar10 = pHVar1;
          }
          if (pHVar10[lVar11].Actor != pAVar3) {
            pHVar10 = pHVar10 + lVar11;
            do {
              lVar11 = (long)pHVar10->Next;
              bVar4 = lVar11 >= 0;
              if (lVar11 < 0) goto LAB_0041ac9d;
              pHVar12 = pHVar9;
              if (pHVar10->Next < 10) {
                pHVar12 = pHVar1;
              }
              pHVar10 = pHVar12 + lVar11;
            } while (pHVar12[lVar11].Actor != pAVar3);
          }
          if (!bVar4) goto LAB_0041ac9d;
        }
        if (bVar4) goto LAB_0041acd1;
      }
      bVar4 = false;
    }
LAB_0041ad47:
    if (!bVar4) {
      return pAVar8;
    }
  } while( true );
}

Assistant:

AActor *FBlockThingsIterator::Next(bool centeronly)
{
	for (;;)
	{
		while (block != NULL)
		{
			AActor *me = block->Me;
			FBlockNode *mynode = block;
			HashEntry *entry;
			int i;

			block = block->NextActor;
			// Don't recheck things that were already checked
			if (mynode->NextBlock == NULL && mynode->PrevBlock == &me->BlockNode)
			{ // This actor doesn't span blocks, so we know it can only ever be checked once.
				return me;
			}
			if (centeronly)
			{
				// Block boundaries for compatibility mode
				double blockleft = (curx * MAPBLOCKUNITS) + bmaporgx;
				double blockright = blockleft + MAPBLOCKUNITS;
				double blockbottom = (cury * MAPBLOCKUNITS) + bmaporgy;
				double blocktop = blockbottom + MAPBLOCKUNITS;

				// only return actors with the center in this block
				if (me->X() >= blockleft && me->X() < blockright &&
					me->Y() >= blockbottom && me->Y() < blocktop)
				{
					return me;
				}
			}
			else
			{
				size_t hash = ((size_t)me >> 3) % countof(Buckets);
				for (i = Buckets[hash]; i >= 0; )
				{
					entry = GetHashEntry(i);
					if (entry->Actor == me)
					{ // I've already been checked. Skip to the next actor.
						break;
					}
					i = entry->Next;
				}
				if (i < 0)
				{ // Add me to the hash table and return me.
					if (NumFixedHash < (int)countof(FixedHash))
					{
						entry = &FixedHash[NumFixedHash];
						entry->Next = Buckets[hash];
						Buckets[hash] = NumFixedHash++;
					}
					else
					{
						if (DynHash.Size() == 0)
						{
							DynHash.Grow(50);
						}
						i = DynHash.Reserve(1);
						entry = &DynHash[i];
						entry->Next = Buckets[hash];
						Buckets[hash] = i + countof(FixedHash);
					}
					entry->Actor = me;
					return me;
				}
			}
		}

		if (++curx > maxx)
		{
			curx = minx;
			if (++cury > maxy) return NULL;
		}
		StartBlock(curx, cury);
	}
}